

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int port;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  char local_f8 [8];
  char socket_address_tcp [128];
  size_t *local_70;
  nn_msghdr hdr;
  nn_iovec iov;
  uchar *puStack_38;
  int i;
  uchar *buf2;
  uchar *buf1;
  int local_20;
  int sc;
  int sb;
  int rc;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _sb = argv;
  argv_local._0_4_ = argc;
  port = get_test_port(argc,argv);
  test_addr_from(local_f8,"tcp","127.0.0.1",port);
  local_20 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c"
                              ,0x32,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",
                 0x33,local_20,"inproc://a");
  buf1._4_4_ = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c"
                                ,0x34,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c"
                    ,0x35,buf1._4_4_,"inproc://a");
  buf2 = (uchar *)nn_allocmsg(0x100,0);
  if (buf2 == (uchar *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x38);
    fflush(_stderr);
    nn_err_abort();
  }
  for (iov.iov_len._4_4_ = 0; iov.iov_len._4_4_ != 0x100; iov.iov_len._4_4_ = iov.iov_len._4_4_ + 1)
  {
    buf2[(int)iov.iov_len._4_4_] = (uchar)iov.iov_len._4_4_;
  }
  sc = nn_send(buf1._4_4_,&buf2,0xffffffffffffffff,0);
  if (sc < 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x3c);
    fflush(_stderr);
    nn_err_abort();
  }
  if (sc != 0x100) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 256",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x3d);
    fflush(_stderr);
    nn_err_abort();
  }
  puStack_38 = (uchar *)0x0;
  sc = nn_recv(local_20,&stack0xffffffffffffffc8,0xffffffffffffffff,0);
  if (sc < 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x41);
    fflush(_stderr);
    nn_err_abort();
  }
  if (sc != 0x100) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 256",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x42);
    fflush(_stderr);
    nn_err_abort();
  }
  if (puStack_38 == (uchar *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","buf2",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x43);
    fflush(_stderr);
    nn_err_abort();
  }
  for (iov.iov_len._4_4_ = 0; iov.iov_len._4_4_ != 0x100; iov.iov_len._4_4_ = iov.iov_len._4_4_ + 1)
  {
    if ((uint)*(byte *)((long)puStack_38 + (long)(int)iov.iov_len._4_4_) !=
        (iov.iov_len._4_4_ & 0xff)) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","buf2 [i] == (unsigned char) i",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x45
             );
      fflush(_stderr);
      nn_err_abort();
    }
  }
  sc = nn_freemsg(puStack_38);
  if (sc != 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x47);
    fflush(_stderr);
    nn_err_abort();
  }
  buf2 = (uchar *)nn_allocmsg(0x100);
  if (buf2 == (uchar *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x4a);
    fflush(_stderr);
    nn_err_abort();
  }
  for (iov.iov_len._4_4_ = 0; iov.iov_len._4_4_ != 0x100; iov.iov_len._4_4_ = iov.iov_len._4_4_ + 1)
  {
    buf2[(int)iov.iov_len._4_4_] = (uchar)iov.iov_len._4_4_;
  }
  hdr.msg_controllen = (size_t)&buf2;
  memset(&local_70,0,0x20);
  local_70 = &hdr.msg_controllen;
  hdr.msg_iov._0_4_ = 1;
  sc = nn_sendmsg(buf1._4_4_,&local_70,0);
  if (sc < 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x53);
    fflush(_stderr);
    nn_err_abort();
  }
  if (sc != 0x100) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 256",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x54);
    fflush(_stderr);
    nn_err_abort();
  }
  puStack_38 = (uchar *)0x0;
  hdr.msg_controllen = (size_t)&stack0xffffffffffffffc8;
  memset(&local_70,0,0x20);
  local_70 = &hdr.msg_controllen;
  hdr.msg_iov._0_4_ = 1;
  sc = nn_recvmsg(local_20,&local_70,0);
  if (sc < 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x5d);
    fflush(_stderr);
    nn_err_abort();
  }
  if (sc != 0x100) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 256",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x5e);
    fflush(_stderr);
    nn_err_abort();
  }
  if (puStack_38 == (uchar *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","buf2",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x5f);
    fflush(_stderr);
    nn_err_abort();
  }
  for (iov.iov_len._4_4_ = 0; iov.iov_len._4_4_ != 0x100; iov.iov_len._4_4_ = iov.iov_len._4_4_ + 1)
  {
    if ((uint)*(byte *)((long)puStack_38 + (long)(int)iov.iov_len._4_4_) !=
        (iov.iov_len._4_4_ & 0xff)) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","buf2 [i] == (unsigned char) i",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x61
             );
      fflush(_stderr);
      nn_err_abort();
    }
  }
  sc = nn_freemsg(puStack_38);
  if (sc != 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",99);
    fflush(_stderr);
    nn_err_abort();
  }
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",
                  0x65,buf1._4_4_);
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",
                  0x66,local_20);
  local_20 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c"
                              ,0x6a,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",
                 0x6b,local_20,local_f8);
  buf1._4_4_ = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c"
                                ,0x6c,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c"
                    ,0x6d,buf1._4_4_,local_f8);
  for (iov.iov_len._4_4_ = 0; (int)iov.iov_len._4_4_ < 0x100000;
      iov.iov_len._4_4_ = iov.iov_len._4_4_ + 1) {
    longdata[(int)iov.iov_len._4_4_] = (char)((int)iov.iov_len._4_4_ % 10) + '0';
  }
  longdata[0xfffff] = '\0';
  test_send_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",
                 0x72,local_20,longdata);
  sc = nn_recv(buf1._4_4_,&stack0xffffffffffffffc8,0xffffffffffffffff,0);
  if (sc < 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x75);
    fflush(_stderr);
    nn_err_abort();
  }
  if (sc != 0xfffff) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == sizeof (longdata) - 1",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x76);
    fflush(_stderr);
    nn_err_abort();
  }
  if (puStack_38 == (uchar *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","buf2",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x77);
    fflush(_stderr);
    nn_err_abort();
  }
  for (iov.iov_len._4_4_ = 0; (int)iov.iov_len._4_4_ < 0xfffff;
      iov.iov_len._4_4_ = iov.iov_len._4_4_ + 1) {
    if ((uint)*(byte *)((long)puStack_38 + (long)(int)iov.iov_len._4_4_) !=
        (int)longdata[(int)iov.iov_len._4_4_]) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","buf2 [i] == longdata [i]",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x79
             );
      fflush(_stderr);
      nn_err_abort();
    }
  }
  sc = nn_freemsg(puStack_38);
  if (sc != 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x7b);
    fflush(_stderr);
    nn_err_abort();
  }
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",
                  0x7d,buf1._4_4_);
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",
                  0x7e,local_20);
  buf2 = (uchar *)nn_allocmsg(8,0);
  if (buf2 == (uchar *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x83);
    fflush(_stderr);
    nn_err_abort();
  }
  puStack_38 = (uchar *)nn_reallocmsg(buf2,1);
  if (puStack_38 != buf2) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","buf2 == buf1",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x87);
    fflush(_stderr);
    nn_err_abort();
  }
  buf2 = (uchar *)nn_reallocmsg(puStack_38,100);
  if (buf2 == puStack_38) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","buf1 != buf2",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x8a);
    fflush(_stderr);
    nn_err_abort();
  }
  if (buf2 == (uchar *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","buf1 != 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x8b);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_freemsg(buf2);
  return 0;
}

Assistant:

int main (int argc, const char *argv[])
{
    int rc;
    int sb;
    int sc;
    unsigned char *buf1, *buf2;
    int i;
    struct nn_iovec iov;
    struct nn_msghdr hdr;
    char socket_address_tcp[128];

    test_addr_from(socket_address_tcp, "tcp", "127.0.0.1",
            get_test_port(argc, argv));

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    buf1 = nn_allocmsg (256, 0);
    alloc_assert (buf1);
    for (i = 0; i != 256; ++i)
        buf1 [i] = (unsigned char) i;
    rc = nn_send (sc, &buf1, NN_MSG, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);

    buf2 = NULL;
    rc = nn_recv (sb, &buf2, NN_MSG, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);
    nn_assert (buf2);
    for (i = 0; i != 256; ++i)
        nn_assert (buf2 [i] == (unsigned char) i);
    rc = nn_freemsg (buf2);
    errno_assert (rc == 0);

    buf1 = nn_allocmsg (256, 0);
    alloc_assert (buf1);
    for (i = 0; i != 256; ++i)
        buf1 [i] = (unsigned char) i;
    iov.iov_base = &buf1;
    iov.iov_len = NN_MSG;
    memset (&hdr, 0, sizeof (hdr));
    hdr.msg_iov = &iov;
    hdr.msg_iovlen = 1;
    rc = nn_sendmsg (sc, &hdr, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);

    buf2 = NULL;
    iov.iov_base = &buf2;
    iov.iov_len = NN_MSG;
    memset (&hdr, 0, sizeof (hdr));
    hdr.msg_iov = &iov;
    hdr.msg_iovlen = 1;
    rc = nn_recvmsg (sb, &hdr, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);
    nn_assert (buf2);
    for (i = 0; i != 256; ++i)
        nn_assert (buf2 [i] == (unsigned char) i);
    rc = nn_freemsg (buf2);
    errno_assert (rc == 0);

    test_close (sc);
    test_close (sb);

    /*  Test receiving of large message  */

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address_tcp);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address_tcp);

    for (i = 0; i < (int) sizeof (longdata); ++i)
        longdata[i] = '0' + (i % 10);
    longdata [sizeof (longdata) - 1] = 0;
    test_send (sb, longdata);

    rc = nn_recv (sc, &buf2, NN_MSG, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == sizeof (longdata) - 1);
    nn_assert (buf2);
    for (i = 0; i < (int) sizeof (longdata) - 1; ++i)
        nn_assert (buf2 [i] == longdata [i]);
    rc = nn_freemsg (buf2);
    errno_assert (rc == 0);

    test_close (sc);
    test_close (sb);


    /*  Test reallocmsg  */
    buf1 = nn_allocmsg (8, 0);
    alloc_assert (buf1);

    buf2 = nn_reallocmsg (buf1, 1);

    nn_assert (buf2 == buf1);

    buf1 = nn_reallocmsg (buf2, 100);
    nn_assert (buf1 != buf2);
    nn_assert (buf1 != 0);

    nn_freemsg (buf1);

    return 0;
}